

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddNestedExtensions(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *filename,
                   DescriptorProto *message_type,pair<const_void_*,_int> value)

{
  int iVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  bool bVar6;
  int iVar7;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  
  iVar7 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar6 = 0 < iVar7;
  auVar2 = value._0_12_;
  if (0 < iVar7) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(message_type->nested_type_).super_RepeatedPtrFieldBase,0);
    value_00._12_4_ = 0;
    value_00.first = (void *)auVar2._0_8_;
    value_00.second = auVar2._8_4_;
    bVar3 = AddNestedExtensions(this,filename,pTVar4,value_00);
    if (bVar3) {
      iVar7 = 1;
      do {
        iVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar6 = iVar7 < iVar1;
        if (iVar1 <= iVar7) goto LAB_002b7528;
        pTVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar7);
        value_01._12_4_ = 0;
        value_01.first = (void *)auVar2._0_8_;
        value_01.second = auVar2._8_4_;
        bVar3 = AddNestedExtensions(this,filename,pTVar4,value_01);
        iVar7 = iVar7 + 1;
      } while (bVar3);
    }
    if (bVar6) {
      return false;
    }
  }
LAB_002b7528:
  iVar7 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
  bVar6 = iVar7 < 1;
  if (0 < iVar7) {
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(message_type->extension_).super_RepeatedPtrFieldBase,0);
    value_02._12_4_ = 0;
    value_02.first = (void *)auVar2._0_8_;
    value_02.second = auVar2._8_4_;
    bVar3 = AddExtension(this,filename,pTVar5,value_02);
    if (bVar3) {
      iVar7 = 1;
      do {
        iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar6 = iVar1 <= iVar7;
        if (iVar1 <= iVar7) {
          return bVar6;
        }
        pTVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar7);
        value_03._12_4_ = 0;
        value_03.first = (void *)auVar2._0_8_;
        value_03.second = auVar2._8_4_;
        bVar3 = AddExtension(this,filename,pTVar5,value_03);
        iVar7 = iVar7 + 1;
      } while (bVar3);
    }
  }
  return bVar6;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}